

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctobin.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int maxsampleindex;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_20 = -1;
  _maxsampleindex = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    local_1c = getopt((int)argv_local,_maxsampleindex,"vhS:");
    if (local_1c == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"",&local_41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"",&local_79);
      initstreams((string *)local_40,(string *)local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_20 != -1) {
        doit(local_20);
        return 0;
      }
      fprintf(_stderr,
              "FATAL: Sample size not supplied - please use -s parameter followed by the sample size\n"
             );
      exit(1);
    }
    if (local_1c != 0x53) break;
    local_20 = atoi(_optarg);
  }
  if ((local_1c != 0x68) && (local_1c == 0x76)) {
    fprintf(_stderr,"%s : version: %s\n",*_maxsampleindex,"");
    exit(1);
  }
  help();
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	int maxsampleindex = -1;
	while ((opt = getopt(argc, argv, (char *) "vhS:")) != -1) {
		switch (opt) {
		case 'S':
			maxsampleindex = atoi(optarg);
			break;

		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;

		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	initstreams();
	if (maxsampleindex == -1) {
		fprintf(stderr, "FATAL: Sample size not supplied - please use -s parameter followed by the sample size\n");
			exit(EXIT_FAILURE);
	}

	doit(maxsampleindex);

	return EXIT_SUCCESS;

}